

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O1

char fsnav_reschedule_plugin(_func_void *plugin,int cycle,int shift)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  int iVar6;
  int *piVar7;
  int iVar8;
  
  iVar2 = -cycle;
  if (0 < cycle) {
    iVar2 = cycle;
  }
  if (cycle == 0) {
    iVar4 = 0;
  }
  else {
    iVar8 = -cycle;
    if (0 < cycle) {
      iVar8 = cycle;
    }
    iVar4 = shift + iVar8;
    iVar6 = -iVar4;
    do {
      iVar4 = iVar4 - iVar8;
      iVar6 = iVar6 + iVar8;
    } while (iVar2 <= iVar4);
    iVar2 = -cycle;
    if (0 < cycle) {
      iVar2 = cycle;
    }
    iVar3 = 0;
    if (0 < iVar4) {
      iVar3 = iVar4;
    }
    iVar4 = iVar8 * (((iVar3 - (uint)(iVar3 != iVar4)) + iVar6) / (iVar2 + (uint)(iVar2 == 0)) +
                    (uint)(iVar3 != iVar4)) + iVar4;
  }
  sVar5 = (fsnav->core).plugin_count;
  if (sVar5 != 0) {
    piVar7 = &((fsnav->core).plugins)->tick;
    cVar1 = '\0';
    do {
      if (((fsnav_plugin *)(piVar7 + -4))->func == plugin) {
        piVar7[-2] = cycle;
        piVar7[-1] = iVar4;
        *piVar7 = 0;
        cVar1 = '\x01';
      }
      piVar7 = piVar7 + 6;
      sVar5 = sVar5 - 1;
    } while (sVar5 != 0);
    return cVar1;
  }
  return '\0';
}

Assistant:

char fsnav_reschedule_plugin(void(*plugin)(void), int cycle, int shift)
{
	size_t i;
	int abs_cycle;
	char flag = 0;
	// shrink shift to [0..cycle-1]
	abs_cycle = abs(cycle);
	if (abs_cycle) {
		while (shift >= abs_cycle)
			shift -= abs_cycle;
		while (shift < 0)
			shift += abs_cycle;
	}
	else
		shift = 0;
	// go through execution list and set scheduling parameters, if found the plugin
	for (i = 0; i < fsnav->core.plugin_count; i++) {
		if (fsnav->core.plugins[i].func == plugin) {
			fsnav->core.plugins[i].cycle = cycle;
			fsnav->core.plugins[i].shift = shift;
			fsnav->core.plugins[i].tick  = 0;
			flag = 1;
		}
	}
	return flag;
}